

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O2

string * BuildRelativeOutputPath(string *__return_storage_ptr__,char **argv,string *inRelativeURL)

{
  allocator<char> local_59;
  FileURL local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,argv[2],&local_59);
  LocalPathToFileURL(&local_58,&local_38);
  RelativeURLToLocalPath(__return_storage_ptr__,&local_58,inRelativeURL);
  FileURL::~FileURL(&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string BuildRelativeOutputPath(char* argv[], const string& inRelativeURL)
{
    return RelativeURLToLocalPath(LocalPathToFileURL(argv[2]), inRelativeURL);
}